

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O3

int cd_array_init(parser_info *info,char **attr)

{
  node_info *pnVar1;
  int iVar2;
  coda_type_array *pcVar3;
  int iVar4;
  
  iVar2 = handle_format_attribute_for_type(info,attr);
  iVar4 = -1;
  if (iVar2 == 0) {
    pnVar1 = info->node;
    pnVar1->free_data = coda_type_release;
    pcVar3 = coda_type_array_new(pnVar1->format);
    info->node->data = pcVar3;
    if (pcVar3 != (coda_type_array *)0x0) {
      iVar2 = handle_name_attribute_for_type(info,attr);
      if (iVar2 == 0) {
        register_type_elements(info->node,cd_array_set_type);
        pnVar1 = info->node;
        pnVar1->init_sub_element[0xd] = optional_integer_constant_or_expression_init;
        pnVar1->add_element_to_parent[0xd] = cd_array_add_dimension;
        pnVar1 = info->node;
        pnVar1->init_sub_element[0xb] = string_data_init;
        pnVar1->add_element_to_parent[0xb] = type_set_description;
        pnVar1 = info->node;
        pnVar1->init_sub_element[4] = cd_attribute_init;
        pnVar1->add_element_to_parent[4] = type_add_attribute;
        info->node->finalise_element = cd_array_finalise;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

static int cd_array_init(parser_info *info, const char **attr)
{
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    info->node->free_data = (free_data_handler)coda_type_release;
    info->node->data = coda_type_array_new(info->node->format);
    if (info->node->data == NULL)
    {
        return -1;
    }
    if (handle_name_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    register_type_elements(info->node, cd_array_set_type);
    register_sub_element(info->node, element_cd_dimension, optional_integer_constant_or_expression_init,
                         cd_array_add_dimension);
    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_attribute, cd_attribute_init, type_add_attribute);
    info->node->finalise_element = cd_array_finalise;

    return 0;
}